

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O2

mk_vhost_handler *
mk_vhost_handler_match(char *match,_func_void_mk_http_request_ptr_void_ptr *cb,void *data)

{
  mk_vhost_handler *__ptr;
  regex_t *reg;
  
  __ptr = (mk_vhost_handler *)mk_mem_alloc(0x50);
  if (__ptr != (mk_vhost_handler *)0x0) {
    __ptr->name = (char *)0x0;
    __ptr->cb = cb;
    __ptr->data = data;
    reg = (regex_t *)mk_mem_alloc(0x2000);
    __ptr->match = reg;
    if (reg != (regex_t *)0x0) {
      (__ptr->params).next = &__ptr->params;
      (__ptr->params).prev = &__ptr->params;
      str_to_regex(match,reg);
      return __ptr;
    }
    free(__ptr);
  }
  return (mk_vhost_handler *)0x0;
}

Assistant:

struct mk_vhost_handler *mk_vhost_handler_match(char *match,
                                                void (*cb)(struct mk_http_request *,
                                                           void *),
                                                void *data)
{
    int ret;
    struct mk_vhost_handler *h;

    h = mk_mem_alloc(sizeof(struct mk_vhost_handler));
    if (!h) {
        return NULL;
    }
    h->name  = NULL;
    h->cb    = cb;
    h->data  = data;
    h->match = mk_mem_alloc(REGEXP_SIZE);
    if (!h->match) {
        mk_mem_free(h);
        return NULL;
    }
    mk_list_init(&h->params);

    ret = str_to_regex(match, h->match);
    if (ret == -1) {
        mk_mem_free(h);
        return NULL;
    }

    return h;
}